

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts5WriteDlidxGrow(Fts5Index *p,Fts5SegWriter *pWriter,int nLvl)

{
  int in_EAX;
  Fts5DlidxWriter *pFVar1;
  void *pvVar2;
  
  if (p->rc != 0) {
    return in_EAX;
  }
  if (pWriter->nDlidx <= nLvl) {
    pFVar1 = (Fts5DlidxWriter *)sqlite3_realloc64(pWriter->aDlidx,(long)nLvl << 5);
    if (pFVar1 == (Fts5DlidxWriter *)0x0) {
      p->rc = 7;
      in_EAX = 0;
    }
    else {
      pvVar2 = memset(pFVar1 + pWriter->nDlidx,0,((long)nLvl - (long)pWriter->nDlidx) * 0x20);
      in_EAX = (int)pvVar2;
      pWriter->aDlidx = pFVar1;
      pWriter->nDlidx = nLvl;
    }
  }
  return in_EAX;
}

Assistant:

static int fts5WriteDlidxGrow(
  Fts5Index *p,
  Fts5SegWriter *pWriter,
  int nLvl
){
  if( p->rc==SQLITE_OK && nLvl>=pWriter->nDlidx ){
    Fts5DlidxWriter *aDlidx = (Fts5DlidxWriter*)sqlite3_realloc64(
        pWriter->aDlidx, sizeof(Fts5DlidxWriter) * nLvl
    );
    if( aDlidx==0 ){
      p->rc = SQLITE_NOMEM;
    }else{
      size_t nByte = sizeof(Fts5DlidxWriter) * (nLvl - pWriter->nDlidx);
      memset(&aDlidx[pWriter->nDlidx], 0, nByte);
      pWriter->aDlidx = aDlidx;
      pWriter->nDlidx = nLvl;
    }
  }
  return p->rc;
}